

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dekkerMul2(double *x,double y,double yy)

{
  long lVar1;
  double *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double cc;
  double c;
  double q;
  double p;
  double ty;
  double tx;
  u64 m;
  double hy;
  double hx;
  double local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (double)((ulong)*in_RDI & 0xfffffffffc000000);
  dVar4 = local_28;
  dVar2 = *in_RDI - local_28;
  local_28 = (double)((ulong)in_XMM0_Qa & 0xfffffffffc000000);
  dVar3 = dVar4 * local_28;
  dVar4 = dVar4 * (in_XMM0_Qa - local_28) + dVar2 * local_28;
  dVar5 = dVar3 + dVar4;
  dVar4 = *in_RDI * in_XMM1_Qa + in_RDI[1] * in_XMM0_Qa +
          dVar2 * (in_XMM0_Qa - local_28) + (dVar3 - dVar5) + dVar4;
  *in_RDI = dVar5 + dVar4;
  in_RDI[1] = dVar5 - *in_RDI;
  in_RDI[1] = in_RDI[1] + dVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void dekkerMul2(volatile double *x, double y, double yy){
  /*
  ** The "volatile" keywords on parameter x[] and on local variables
  ** below are needed force intermediate results to be truncated to
  ** binary64 rather than be carried around in an extended-precision
  ** format.  The truncation is necessary for the Dekker algorithm to
  ** work.  Intel x86 floating point might omit the truncation without
  ** the use of volatile.
  */
  volatile double tx, ty, p, q, c, cc;
  double hx, hy;
  u64 m;
  memcpy(&m, (void*)&x[0], 8);
  m &= 0xfffffffffc000000LL;
  memcpy(&hx, &m, 8);
  tx = x[0] - hx;
  memcpy(&m, &y, 8);
  m &= 0xfffffffffc000000LL;
  memcpy(&hy, &m, 8);
  ty = y - hy;
  p = hx*hy;
  q = hx*ty + tx*hy;
  c = p+q;
  cc = p - c + q + tx*ty;
  cc = x[0]*yy + x[1]*y + cc;
  x[0] = c + cc;
  x[1] = c - x[0];
  x[1] += cc;
}